

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double f_mean(int param_1,int n)

{
  if (2 < n) {
    return (double)n / (double)(n + -2);
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"F_MEAN - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  The mean is not defined for N < 3.\n");
  exit(1);
}

Assistant:

double f_mean ( int /*m*/, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_MEAN returns the mean of the F central PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//    Note, however, that the mean is not defined unless 3 <= N.
//
//    Output, double F_MEAN, the mean of the PDF.
//
{
  double mean;

  if ( n < 3 )
  {
    cerr << " \n";
    cerr << "F_MEAN - Fatal error!\n";
    cerr << "  The mean is not defined for N < 3.\n";
    exit ( 1 );
  }

  mean = static_cast<double>(n ) / static_cast<double>(n - 2 );

  return mean;
}